

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctf-2-json-val-req.cpp
# Opt level: O3

void __thiscall
yactfr::internal::JsonIntRangeSetValReqBase<yactfr::internal::JsonSIntValReq>::
JsonIntRangeSetValReqBase(JsonIntRangeSetValReqBase<yactfr::internal::JsonSIntValReq> *this)

{
  undefined1 local_69;
  Sp local_68;
  element_type *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_50 [2];
  optional<unsigned_long_long> local_40;
  optional<unsigned_long_long> local_30;
  
  local_30.super_type.m_initialized = true;
  local_30.super_type.m_storage = 1;
  local_40.super_type.m_initialized = false;
  local_58 = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<yactfr::internal::JsonIntRangeValReqBase<yactfr::internal::JsonSIntValReq>,std::allocator<yactfr::internal::JsonIntRangeValReqBase<yactfr::internal::JsonSIntValReq>>>
            (a_Stack_50,(JsonIntRangeValReqBase<yactfr::internal::JsonSIntValReq> **)&local_58,
             (allocator<yactfr::internal::JsonIntRangeValReqBase<yactfr::internal::JsonSIntValReq>_>
              *)&local_69);
  local_68.super___shared_ptr<const_yactfr::internal::JsonValReq,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = local_58;
  local_68.super___shared_ptr<const_yactfr::internal::JsonValReq,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = a_Stack_50[0]._M_pi;
  JsonArrayValReq::JsonArrayValReq(&this->super_JsonArrayValReq,&local_30,&local_40,&local_68);
  if (local_68.super___shared_ptr<const_yactfr::internal::JsonValReq,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.
               super___shared_ptr<const_yactfr::internal::JsonValReq,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  (this->super_JsonArrayValReq).super_JsonValReq._vptr_JsonValReq =
       (_func_int **)&PTR__JsonArrayValReq_002fc088;
  return;
}

Assistant:

explicit JsonIntRangeSetValReqBase() :
        JsonArrayValReq {1, boost::none, JsonIntRangeValReqBase<JsonIntValReqT>::shared()}
    {
    }